

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

Node * GetIPChannel_abi_cxx11_(Node *IOChannel,int InputFlag)

{
  int in_EDX;
  undefined4 in_register_00000034;
  bool local_99;
  undefined1 local_98 [66];
  allocator local_56;
  allocator local_55 [20];
  byte local_41;
  undefined1 local_40 [44];
  int InputFlag_local;
  Node *IOChannel_local;
  
  register0x00000030 = (Node *)CONCAT44(in_register_00000034,InputFlag);
  local_41 = 0;
  local_99 = true;
  local_40._36_4_ = in_EDX;
  IOChannel_local = IOChannel;
  if (register0x00000030 != (Node *)0x0) {
    Node::NoParen_abi_cxx11_((Node *)local_40);
    local_41 = 1;
    local_99 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_40,"0");
  }
  if ((local_41 & 1) != 0) {
    std::__cxx11::string::~string((string *)local_40);
  }
  if (local_99 == false) {
    Node::Expression_abi_cxx11_((Node *)local_98);
    std::operator+(local_98 + 0x20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14b167);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)IOChannel,
                   local_98 + 0x20);
    std::__cxx11::string::~string((string *)(local_98 + 0x20));
    std::__cxx11::string::~string((string *)local_98);
  }
  else if (local_40._36_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)IOChannel,"std::cout",local_55);
    std::allocator<char>::~allocator((allocator<char> *)local_55);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)IOChannel,"std::cin",&local_56);
    std::allocator<char>::~allocator((allocator<char> *)&local_56);
  }
  return IOChannel;
}

Assistant:

std::string GetIPChannel(
	Node *IOChannel,	/**< IOChannel. May be zero */
	int InputFlag		/**< INPUT/PRINT flag */
)
{
	//
	// Use default if no channel specified, else use
	// whatever is given
	//
	if ((IOChannel == 0) || (IOChannel->NoParen() == "0"))
	{
		if (InputFlag == 0)
		{
			return "std::cout";
		}
		else
		{
			return "std::cin";
		}
	}
	else
	{
		return "BasicChannel[" + IOChannel->Expression() + "]";
	}

}